

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

int __thiscall
crnlib::static_huffman_data_model::init(static_huffman_data_model *this,EVP_PKEY_CTX *ctx)

{
  vector<unsigned_short> *this_00;
  byte bVar1;
  uint32 *puVar2;
  uint16 *puVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  undefined7 extraout_var;
  decoder_tables *pdVar7;
  undefined7 extraout_var_00;
  undefined7 uVar8;
  uint uVar9;
  uint uVar10;
  long in_RCX;
  uint in_EDX;
  ulong uVar11;
  uint uVar12;
  uint in_R8D;
  uint uVar13;
  
  uVar13 = 0x10;
  if (in_R8D < 0x10) {
    uVar13 = in_R8D;
  }
  this->m_encoding = SUB81(ctx,0);
  uVar10 = (this->m_code_sizes).m_size;
  if (uVar10 != in_EDX) {
    if (uVar10 <= in_EDX) {
      if ((this->m_code_sizes).m_capacity < in_EDX) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_code_sizes,in_EDX,uVar10 + 1 == in_EDX,1,
                   (object_mover)0x0,false);
      }
      uVar10 = (this->m_code_sizes).m_size;
      memset((this->m_code_sizes).m_p + uVar10,0,(ulong)(in_EDX - uVar10));
    }
    (this->m_code_sizes).m_size = in_EDX;
  }
  if (in_EDX == 0) {
    uVar12 = 0;
    uVar10 = 0xffffffff;
  }
  else {
    uVar10 = 0xffffffff;
    uVar11 = 0;
    uVar12 = 0;
    do {
      bVar1 = *(byte *)(in_RCX + uVar11);
      (this->m_code_sizes).m_p[uVar11] = bVar1;
      uVar9 = (uint)bVar1;
      if (uVar9 <= uVar10) {
        uVar10 = uVar9;
      }
      uVar4 = (uint)bVar1;
      if (uVar9 < uVar12) {
        uVar4 = uVar12;
      }
      uVar12 = uVar4;
      uVar11 = uVar11 + 1;
    } while (in_EDX != uVar11);
  }
  if ((uVar10 <= uVar13 && 0xffffffdf < uVar12 - 0x21) &&
     ((uVar12 <= uVar13 ||
      (bVar5 = prefix_coding::limit_max_code_size
                         (this->m_total_syms,(this->m_code_sizes).m_p,uVar13), bVar5)))) {
    this_00 = &this->m_codes;
    if (this->m_encoding == true) {
      uVar13 = (this->m_codes).m_size;
      if (uVar13 != in_EDX) {
        if (uVar13 <= in_EDX) {
          if ((this->m_codes).m_capacity < in_EDX) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)this_00,in_EDX,uVar13 + 1 == in_EDX,2,(object_mover)0x0,
                       false);
          }
          uVar13 = (this->m_codes).m_size;
          memset((this->m_codes).m_p + uVar13,0,(ulong)(in_EDX - uVar13) * 2);
        }
        (this->m_codes).m_size = in_EDX;
      }
      pdVar7 = this->m_pDecode_tables;
      if (pdVar7 != (decoder_tables *)0x0) {
        puVar2 = pdVar7->m_lookup;
        if ((puVar2 != (uint32 *)0x0) && ((puVar2[-2] ^ puVar2[-1]) == 0xffffffff)) {
          crnlib_free(puVar2 + -4);
        }
        puVar3 = pdVar7->m_sorted_symbol_order;
        if ((puVar3 != (uint16 *)0x0) &&
           ((*(uint *)(puVar3 + -4) ^ *(uint *)(puVar3 + -2)) == 0xffffffff)) {
          crnlib_free(puVar3 + -8);
        }
        crnlib_free(pdVar7);
        this->m_pDecode_tables = (decoder_tables *)0x0;
      }
      bVar5 = prefix_coding::generate_codes
                        (this->m_total_syms,(this->m_code_sizes).m_p,(this->m_codes).m_p);
      uVar8 = extraout_var;
    }
    else {
      if (this_00->m_p != (unsigned_short *)0x0) {
        crnlib_free(this_00->m_p);
        this_00->m_p = (unsigned_short *)0x0;
        (this->m_codes).m_size = 0;
        (this->m_codes).m_capacity = 0;
      }
      if (this->m_pDecode_tables == (decoder_tables *)0x0) {
        pdVar7 = (decoder_tables *)crnlib_malloc(0xc0);
        pdVar7->m_table_shift = 0;
        pdVar7->m_table_max_code = 0;
        pdVar7->m_decode_start_code_size = 0;
        pdVar7->m_sorted_symbol_order = (uint16 *)0x0;
        *(undefined8 *)&pdVar7->m_cur_lookup_size = 0;
        *(undefined8 *)((long)&pdVar7->m_lookup + 4) = 0;
        this->m_pDecode_tables = pdVar7;
      }
      uVar13 = this->m_total_syms;
      uVar10 = 0;
      if (0x10 < uVar13) {
        iVar6 = 0;
        uVar10 = uVar13;
        do {
          iVar6 = iVar6 + -1;
          bVar5 = 3 < uVar10;
          uVar10 = uVar10 >> 1;
        } while (bVar5);
        uVar10 = (((uint)(2 << (~(byte)iVar6 & 0x1f)) < uVar13) + 1) - iVar6;
        if (10 < uVar10) {
          uVar10 = 0xb;
        }
        if (iVar6 == -0x20) {
          uVar10 = 0xb;
        }
      }
      bVar5 = prefix_coding::generate_decoder_tables
                        (uVar13,(this->m_code_sizes).m_p,this->m_pDecode_tables,uVar10);
      uVar8 = extraout_var_00;
    }
    if (bVar5 != false) {
      return (int)CONCAT71(uVar8,1);
    }
  }
  return 0;
}

Assistant:

bool static_huffman_data_model::init(bool encoding, uint total_syms, const uint8* pCode_sizes, uint code_size_limit)
    {
        CRNLIB_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms) && (code_size_limit >= 1));

        m_encoding = encoding;

        code_size_limit = math::minimum(code_size_limit, prefix_coding::cMaxExpectedCodeSize);

        m_code_sizes.resize(total_syms);

        uint min_code_size = UINT_MAX;
        uint max_code_size = 0;

        for (uint i = 0; i < total_syms; i++)
        {
            uint s = pCode_sizes[i];
            m_code_sizes[i] = static_cast<uint8>(s);
            min_code_size = math::minimum(min_code_size, s);
            max_code_size = math::maximum(max_code_size, s);
        }

        if ((max_code_size < 1) || (max_code_size > 32) || (min_code_size > code_size_limit))
        {
            return false;
        }

        if (max_code_size > code_size_limit)
        {
            if (!prefix_coding::limit_max_code_size(m_total_syms, &m_code_sizes[0], code_size_limit))
            {
                return false;
            }
        }

        if (m_encoding)
        {
            m_codes.resize(total_syms);

            if (m_pDecode_tables)
            {
                crnlib_delete(m_pDecode_tables);
                m_pDecode_tables = nullptr;
            }

            if (!prefix_coding::generate_codes(m_total_syms, &m_code_sizes[0], &m_codes[0]))
            {
                return false;
            }
        }
        else
        {
            m_codes.clear();

            if (!m_pDecode_tables)
            {
                m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>();
            }

            if (!prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, compute_decoder_table_bits()))
            {
                return false;
            }
        }

        return true;
    }